

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::StartSubexpression(ByteCodeWriter *this,ParseNode *node)

{
  Type *pTVar1;
  uint uVar2;
  int iVar3;
  List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pSVar4;
  
  if ((this->m_isInDebugMode == true) && (this->m_pMatchingNode != (ParseNode *)0x0)) {
    EnsureLongBranch(this,StatementBoundary);
    this_00 = &this->m_subexpressionNodesStack->list;
    uVar2 = (this->m_byteCodeData).currentOffset;
    JsUtil::
    List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(this_00,0);
    pSVar4 = (this_00->
             super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
             ).buffer;
    iVar3 = (this_00->
            super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    pSVar4[iVar3].node = node;
    pSVar4[iVar3].beginCodeSpan = uVar2;
    pTVar1 = &(this_00->
              super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
              ).count;
    *pTVar1 = *pTVar1 + 1;
  }
  return;
}

Assistant:

void ByteCodeWriter::StartSubexpression(ParseNode* node)
    {
        if (!m_isInDebugMode || !m_pMatchingNode) // Subexpression not in debug mode or not enclosed in regular statement
        {
            return;
        }
#ifdef BYTECODE_BRANCH_ISLAND
        // If we are going to emit a branch island, it should be before the statement start
        this->EnsureLongBranch(Js::OpCode::StatementBoundary);
#endif
        m_subexpressionNodesStack->Push(SubexpressionNode(node, m_byteCodeData.GetCurrentOffset()));
    }